

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDLGraphicsSystemTests.cpp
# Opt level: O1

void __thiscall
solitaire::graphics::SDLGraphicsSystemTests::expectQuitSystem(SDLGraphicsSystemTests *this)

{
  FunctionMocker<void_()> *this_00;
  PtrDeleterMock *pPVar1;
  StrictMock<solitaire::SDL::WrapperMock> *mock_obj;
  MockSpec<void_(SDL_Renderer_*)> local_50;
  MatcherBase<SDL_Renderer_*> local_30;
  
  pPVar1 = &((this->ptrDeleterMock).
             super___shared_ptr<testing::StrictMock<solitaire::SDL::PtrDeleterMock>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr)->super_PtrDeleterMock;
  testing::Matcher<SDL_Renderer_*>::Matcher((Matcher<SDL_Renderer_*> *)&local_30,(Snapshot *)0x2);
  SDL::PtrDeleterMock::gmock_rendererDeleter(&local_50,pPVar1,(Matcher<SDL_Renderer_*> *)&local_30);
  testing::internal::GetWithoutMatchers();
  testing::internal::MockSpec<void_(SDL_Renderer_*)>::InternalExpectedAt
            (&local_50,
             "/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/graphics/SDLGraphicsSystemTests.cpp"
             ,0x71,"*ptrDeleterMock","rendererDeleter(rendererPtr)");
  testing::internal::MatcherBase<SDL_Renderer_*>::~MatcherBase
            ((MatcherBase<SDL_Renderer_*> *)&local_50.matchers_);
  testing::internal::MatcherBase<SDL_Renderer_*>::~MatcherBase(&local_30);
  pPVar1 = &((this->ptrDeleterMock).
             super___shared_ptr<testing::StrictMock<solitaire::SDL::PtrDeleterMock>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr)->super_PtrDeleterMock;
  testing::Matcher<SDL_Window_*>::Matcher((Matcher<SDL_Window_*> *)&local_30,(Snapshot *)0x1);
  SDL::PtrDeleterMock::gmock_windowDeleter
            ((MockSpec<void_(SDL_Window_*)> *)&local_50,pPVar1,(Matcher<SDL_Window_*> *)&local_30);
  testing::internal::GetWithoutMatchers();
  testing::internal::MockSpec<void_(SDL_Window_*)>::InternalExpectedAt
            ((MockSpec<void_(SDL_Window_*)> *)&local_50,
             "/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/graphics/SDLGraphicsSystemTests.cpp"
             ,0x72,"*ptrDeleterMock","windowDeleter(windowPtr)");
  testing::internal::MatcherBase<SDL_Window_*>::~MatcherBase
            ((MatcherBase<SDL_Window_*> *)&local_50.matchers_);
  testing::internal::MatcherBase<SDL_Window_*>::~MatcherBase((MatcherBase<SDL_Window_*> *)&local_30)
  ;
  mock_obj = (this->sdlMock).rawPointer;
  this_00 = &(mock_obj->super_WrapperMock).gmock10_quit_12;
  testing::internal::UntypedFunctionMockerBase::RegisterOwner
            (&this_00->super_UntypedFunctionMockerBase,mock_obj);
  local_50.function_mocker_ = (FunctionMocker<void_(SDL_Renderer_*)> *)this_00;
  testing::internal::GetWithoutMatchers();
  testing::internal::MockSpec<void_()>::InternalExpectedAt
            ((MockSpec<void_()> *)&local_50,
             "/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/graphics/SDLGraphicsSystemTests.cpp"
             ,0x73,"*sdlMock","quit()");
  return;
}

Assistant:

void expectQuitSystem() {
        EXPECT_CALL(*ptrDeleterMock, rendererDeleter(rendererPtr));
        EXPECT_CALL(*ptrDeleterMock, windowDeleter(windowPtr));
        EXPECT_CALL(*sdlMock, quit());
    }